

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evdevdevice.h
# Opt level: O1

void __thiscall
EvdevDevice::EvdevDevice
          (EvdevDevice *this,vector<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_> *inputs
          )

{
  pointer pIVar1;
  Input *input;
  pointer input_00;
  
  memset(this,0,0x628);
  pIVar1 = (inputs->super__Vector_base<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (input_00 = (inputs->
                  super__Vector_base<EvdevDevice::Input,_std::allocator<EvdevDevice::Input>_>).
                  _M_impl.super__Vector_impl_data._M_start; input_00 != pIVar1;
      input_00 = input_00 + 1) {
    addDevice(this,input_00);
  }
  return;
}

Assistant:

EvdevDevice::EvdevDevice(std::vector<Input> const& inputs) :
  _devices(), _events(), _numEvents(0), _currentEvent(0), _currentRole(0), _previousDevice(0)
{
  for(Input const& input : inputs)
  {
    addDevice(input);
  }
}